

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctsa.c
# Opt level: O3

myarima_object
myarima(double *x,int N,int *order,int *seasonal,int constant,char *ic,int trace,int approx,
       double offset,double *xreg,int r,int *method)

{
  int s;
  double *pdVar1;
  int iVar2;
  myarima_object pmVar3;
  double *pdVar4;
  sarimax_object obj;
  double *coeff;
  double *pdVar5;
  double *pdVar6;
  uint uVar7;
  long lVar8;
  int q;
  ulong uVar9;
  ulong uVar10;
  int iVar11;
  int p;
  ulong uVar12;
  int iVar13;
  int iVar14;
  size_t __size;
  double dVar15;
  double dVar16;
  double dVar17;
  ulong local_58;
  uint local_38;
  uint local_34;
  
  pmVar3 = (myarima_object)malloc(0x38);
  pmVar3->aicc = 1.79769313486232e+308;
  pmVar3->bic = 1.79769313486232e+308;
  pmVar3->aic = 1.79769313486232e+308;
  pmVar3->ic = 1.79769313486232e+308;
  s = 0;
  local_58 = 0;
  iVar2 = 0;
  uVar9 = 0;
  if (order != (int *)0x0) {
    uVar9 = (ulong)(uint)*order;
    iVar2 = order[1];
    local_58 = (ulong)(uint)order[2];
  }
  local_34 = 0;
  iVar11 = 0;
  local_38 = 0;
  if (seasonal != (int *)0x0) {
    local_38 = *seasonal;
    iVar11 = seasonal[1];
    local_34 = seasonal[2];
    s = seasonal[3];
  }
  if (method == (int *)0x0) {
    iVar13 = (uint)(approx != 0) * 2;
  }
  else {
    iVar13 = *method;
  }
  p = (int)uVar9;
  q = (int)local_58;
  if (constant == 1 && iVar2 + iVar11 == 1) {
    lVar8 = (long)N * 8;
    pdVar4 = (double *)malloc((r + 1) * lVar8);
    if (0 < N) {
      uVar10 = 0;
      do {
        uVar12 = uVar10 + 1;
        pdVar4[uVar10] = (double)(int)uVar12;
        uVar10 = uVar12;
      } while ((uint)N != uVar12);
    }
    memcpy(pdVar4 + N,xreg,lVar8 * r);
    obj = sarimax_init(p,iVar2,q,local_38,iVar11,local_34,s,r + 1,1,N);
    pmVar3->sarimax = obj;
    sarimax_exec(obj,x,pdVar4);
    free(pdVar4);
  }
  else if (r < 1) {
    obj = sarimax_init(p,iVar2,q,local_38,iVar11,local_34,s,0,constant,N);
    pmVar3->sarimax = obj;
    if (iVar13 == 2) {
      obj->method = 2;
    }
    else if (iVar13 == 1) {
      obj->method = 1;
    }
    else if (iVar13 == 0) {
      obj->method = 0;
    }
    else {
      puts("\n Acceptable Numerical Values 0 - CSS-MLE, 1 - MLE, 2 - CSS ");
    }
    sarimax_exec(obj,x,(double *)0x0);
  }
  else {
    __size = (ulong)(uint)r * (long)N * 8;
    pdVar4 = (double *)malloc(__size);
    memcpy(pdVar4,xreg,__size);
    obj = sarimax_init(p,iVar2,q,local_38,iVar11,local_34,s,r,constant,N);
    pmVar3->sarimax = obj;
    if (iVar13 == 2) {
      obj->method = 2;
    }
    else if (iVar13 == 1) {
      obj->method = 1;
    }
    else if (iVar13 == 0) {
      obj->method = 0;
    }
    else {
      puts("\n Acceptable Numerical Values 0 - CSS-MLE, 1 - MLE, 2 - CSS ");
    }
    sarimax_exec(obj,x,pdVar4);
    free(pdVar4);
  }
  if (obj->retval != 1) {
    pmVar3->ic = 1.79769313486232e+308;
    return pmVar3;
  }
  iVar2 = obj->M;
  iVar11 = obj->q + obj->p + obj->P + obj->Q;
  iVar14 = iVar11 + iVar2 + 1;
  if (iVar13 == 2) {
    iVar13 = obj->Nused;
    dVar15 = log(obj->var);
    dVar15 = (double)(iVar14 * 2) + dVar15 * (double)iVar13 + offset;
    obj->aic = dVar15;
  }
  else {
    dVar15 = obj->aic;
  }
  iVar11 = iVar11 + iVar2;
  if ((dVar15 != 0.0) || (NAN(dVar15))) {
    pmVar3->aic = dVar15;
    dVar16 = log((double)obj->Nused);
    dVar16 = (dVar16 + -2.0) * (double)iVar14 + dVar15;
    pmVar3->bic = dVar16;
    uVar7 = obj->Nused;
    dVar17 = (double)((iVar11 + 2) * iVar14 * 2) / (double)(int)((uVar7 - iVar11) + -2) + dVar15;
    pmVar3->aicc = dVar17;
    iVar2 = strcmp(ic,"aic");
    if ((iVar2 != 0) &&
       ((iVar2 = strcmp(ic,"bic"), dVar15 = dVar16, iVar2 != 0 &&
        (iVar2 = strcmp(ic,"aicc"), dVar15 = dVar17, iVar2 != 0)))) goto LAB_0010bf38;
    pmVar3->ic = dVar15;
  }
  else {
    pmVar3->aicc = 1.79769313486232e+308;
    pmVar3->bic = 1.79769313486232e+308;
    pmVar3->aic = 1.79769313486232e+308;
    pmVar3->ic = 1.79769313486232e+308;
    uVar7 = obj->Nused;
LAB_0010bf38:
    dVar15 = 1.79769313486232e+308;
  }
  if ((int)uVar7 < 1) {
    dVar16 = 0.0;
  }
  else {
    dVar16 = 0.0;
    uVar10 = 0;
    do {
      dVar16 = dVar16 + obj->res[uVar10] * obj->res[uVar10];
      uVar10 = uVar10 + 1;
    } while (uVar7 != uVar10);
  }
  pmVar3->sigma2 = dVar16 / (double)(int)(uVar7 - iVar11);
  iVar11 = local_38 * s + p + 1;
  iVar2 = local_34 * s + q + 1;
  pdVar4 = (double *)calloc((long)iVar11,8);
  coeff = (double *)calloc((long)iVar2,8);
  *coeff = 1.0;
  *pdVar4 = 1.0;
  if (0 < p) {
    pdVar5 = obj->phi;
    uVar10 = 0;
    do {
      pdVar4[uVar10 + 1] = pdVar5[uVar10];
      uVar10 = uVar10 + 1;
    } while (uVar9 != uVar10);
  }
  if (0 < q) {
    pdVar5 = obj->theta;
    uVar10 = 0;
    do {
      coeff[uVar10 + 1] = -pdVar5[uVar10];
      uVar10 = uVar10 + 1;
    } while (local_58 != uVar10);
  }
  lVar8 = (long)s;
  if (0 < (int)local_38) {
    pdVar5 = obj->PHI;
    pdVar6 = pdVar4 + lVar8 + 1;
    uVar10 = 0;
    do {
      dVar16 = pdVar5[uVar10];
      uVar10 = uVar10 + 1;
      pdVar4[uVar10 * lVar8] = pdVar4[uVar10 * lVar8] + dVar16;
      if (0 < p) {
        pdVar1 = obj->phi;
        uVar12 = 0;
        do {
          pdVar6[uVar12] = pdVar6[uVar12] - pdVar1[uVar12] * dVar16;
          uVar12 = uVar12 + 1;
        } while (uVar9 != uVar12);
      }
      pdVar6 = pdVar6 + lVar8;
    } while (uVar10 != local_38);
  }
  if (0 < (int)local_34) {
    pdVar5 = obj->THETA;
    pdVar6 = coeff + lVar8 + 1;
    uVar9 = 0;
    do {
      dVar16 = pdVar5[uVar9];
      uVar9 = uVar9 + 1;
      coeff[uVar9 * lVar8] = coeff[uVar9 * lVar8] - dVar16;
      if (0 < q) {
        pdVar1 = obj->theta;
        uVar10 = 0;
        do {
          pdVar6[uVar10] = pdVar1[uVar10] * dVar16 + pdVar6[uVar10];
          uVar10 = uVar10 + 1;
        } while (local_58 != uVar10);
      }
      pdVar6 = pdVar6 + lVar8;
    } while (uVar9 != local_34);
  }
  if (iVar2 < iVar11) {
    iVar2 = iVar11;
  }
  pdVar5 = (double *)malloc((long)iVar2 << 3);
  pdVar6 = (double *)malloc((long)iVar2 << 3);
  dVar16 = 2.0;
  if ((local_38 + p == 0 || SCARRY4(local_38,p) != (int)(local_38 + p) < 0) ||
     (uVar7 = local_38 * s + p, (int)uVar7 < 1)) {
LAB_0010c267:
    if (((1 < (int)(local_34 + q)) && (dVar15 < 1.79769313486232e+308)) &&
       (uVar7 = local_34 * s + q, 0 < (int)uVar7)) {
      uVar10 = 0xffffffff;
      uVar9 = 0;
      do {
        if (1e-08 < ABS(coeff[uVar9 + 1])) {
          uVar10 = uVar9 & 0xffffffff;
        }
        uVar9 = uVar9 + 1;
      } while (uVar7 != uVar9);
      if (-1 < (int)uVar10) {
        uVar7 = (int)uVar10 + 1;
        iVar2 = polyroot(coeff,uVar7,pdVar5,pdVar6);
        if (iVar2 == 0) {
          uVar9 = 0;
          dVar15 = dVar16;
          do {
            dVar16 = SQRT(pdVar5[uVar9] * pdVar5[uVar9] + pdVar6[uVar9] * pdVar6[uVar9]);
            if (dVar15 <= dVar16) {
              dVar16 = dVar15;
            }
            uVar9 = uVar9 + 1;
            dVar15 = dVar16;
          } while (uVar7 != uVar9);
        }
        else {
          pmVar3->ic = 1.79769313486232e+308;
        }
      }
    }
    if (1.01 <= dVar16) goto LAB_0010c324;
  }
  else {
    uVar10 = 0xffffffff;
    uVar9 = 0;
    do {
      if (1e-08 < ABS(pdVar4[uVar9 + 1])) {
        uVar10 = uVar9 & 0xffffffff;
      }
      uVar9 = uVar9 + 1;
    } while (uVar7 != uVar9);
    if ((int)uVar10 < 0) goto LAB_0010c267;
    uVar7 = (int)uVar10 + 1;
    uVar9 = 0;
    do {
      pdVar4[uVar9 + 1] = -pdVar4[uVar9 + 1];
      uVar9 = uVar9 + 1;
    } while (uVar7 != uVar9);
    iVar2 = polyroot(pdVar4,uVar7,pdVar5,pdVar6);
    if (iVar2 == 0) {
      dVar16 = 2.0;
      uVar9 = 0;
      do {
        dVar17 = SQRT(pdVar5[uVar9] * pdVar5[uVar9] + pdVar6[uVar9] * pdVar6[uVar9]);
        if (dVar16 <= dVar17) {
          dVar17 = dVar16;
        }
        dVar16 = dVar17;
        uVar9 = uVar9 + 1;
      } while (uVar7 != uVar9);
      goto LAB_0010c267;
    }
  }
  pmVar3->ic = 1.79769313486232e+308;
LAB_0010c324:
  free(pdVar4);
  free(coeff);
  free(pdVar5);
  free(pdVar6);
  return pmVar3;
}

Assistant:

myarima_object myarima(double *x, int N, int *order, int *seasonal, int constant, const char* ic, int trace, int approx,
	double offset, double *xreg, int r, int *method) {

	myarima_object fit = NULL;
	int m,p,d,q,P,D,Q,s,diffs,i,j,imean,ncoeff,isum,imx,rr;
	int use_season,rmethod,last_nonzero,ip,iq,ir,retval;
	double rsum,minroot,tol,temp;
	double *xreg2,*phi,*theta,*zeror,*zeroi;
	int *K;

	fit = (myarima_object) malloc (sizeof(struct myarima_set));
	
	fit->ic = fit->aic = fit->bic = fit->aicc = DBL_MAX;

	tol = 1e-08;

	if (order) {
		p = order[0];
		d = order[1];
		q = order[2];
	} else {
		p = 0;
		d = 0;
		q = 0;
	}

	if (seasonal) {
		P = seasonal[0];
		D = seasonal[1];
		Q = seasonal[2];
		s = seasonal[3];
		if ( s > 0) {
			m = s;
		} else {
			m = 1;
		}
	} else {
		P = 0;
		D = 0;
		Q = 0;
		s = 0;
		m = 1;
	}

	diffs = d + D;

	if ( P + D + Q > 0 && s > 0) {
		use_season = 1;
	} else {
		use_season = 0;
	}

	if (method == NULL) {
		if (approx) {
			rmethod = 2;
		} else {
			rmethod = 0;
		}
	} else {
		rmethod = *method;
	}

	rr = r;

	if (diffs == 1 && constant == 1) {
		imean = 1;
		rr++;
		xreg2 = (double*)malloc(sizeof(double)*N*rr);
		for(i = 0; i < N;++i) {
			xreg2[i] = (double) (i+1);
		}
		memcpy(xreg2+N,xreg,sizeof(double)*N*(rr-1));
		fit->sarimax = sarimax_init(p,d,q,P,D,Q,s,rr,imean,N);
		sarimax_exec(fit->sarimax,x,xreg2);
		free(xreg2);
		//sarimax_summary(fit->sarimax);
	} else {
		imean = constant;
		if (rr > 0) {
			xreg2 = (double*)malloc(sizeof(double)*N*rr);
			memcpy(xreg2,xreg,sizeof(double)*N*rr);
			fit->sarimax = sarimax_init(p,d,q,P,D,Q,s,rr,imean,N);
			sarimax_setMethod(fit->sarimax,rmethod);
			sarimax_exec(fit->sarimax,x,xreg2);
			free(xreg2);
		} else {
			//printf("p: %d d: %d q: %d P: %d D: %d Q: %d s: %d imean %d \n",p,d,q,P,D,Q,s,imean);
			fit->sarimax = sarimax_init(p,d,q,P,D,Q,s,0,imean,N);
			sarimax_setMethod(fit->sarimax,rmethod);
			//mdisplay(x,1,N);
			sarimax_exec(fit->sarimax,x,NULL);
			//sarimax_summary(fit->sarimax);
		}
		
	}

	if (fit->sarimax->retval == 1) {
		ncoeff = (fit->sarimax->p + fit->sarimax->q + fit->sarimax->P + fit->sarimax->Q + fit->sarimax->M) + 1;

		if (rmethod == 2) {
			fit->sarimax->aic = offset + fit->sarimax->Nused * log(fit->sarimax->var) + 2 * ncoeff;// sigma2 
		}

		if (fit->sarimax->aic) {
			fit->aic = fit->sarimax->aic;
			fit->bic = fit->aic + ncoeff * (log((double)fit->sarimax->Nused) - 2.0);
			fit->aicc = fit->aic + 2 * ncoeff * (ncoeff + 1) / (double) (fit->sarimax->Nused - ncoeff - 1);
			if (!strcmp(ic,"aic")) {
				fit->ic = fit->aic;
			} else if (!strcmp(ic,"bic")) {
				fit->ic = fit->bic;
			} else if (!strcmp(ic,"aicc")) {
				fit->ic = fit->aicc;
			}
		} else {
			fit->ic = fit->aic = fit->bic = fit->aicc = DBL_MAX;
		}

		//printf("aic %g bic %g aicc %g ic %g \n",fit->aic,fit->bic,fit->aicc,fit->ic);

		rsum = 0.0;

		for(i = 0; i < fit->sarimax->Nused;++i) {
			rsum += fit->sarimax->res[i]*fit->sarimax->res[i];
		}

		fit->sigma2 = rsum / (double) (fit->sarimax->Nused - ncoeff + 1);

		minroot = 2.0;

		ip = p + s*P + 1;
		iq = q + s*Q + 1;

		phi = (double*)calloc(ip,sizeof(double));
		theta = (double*)calloc(iq,sizeof(double));

		phi[0] = theta[0] = 1.0;

		for(i = 0; i < p;++i) {
			phi[i+1] = fit->sarimax->phi[i];
		}

		for(i = 0; i < q; ++i) {
			theta[i+1] = -1.0 * fit->sarimax->theta[i];
		}

		for (j = 0; j < P; ++j) {
			phi[(j + 1)*s] += fit->sarimax->PHI[j];
			for (i = 0; i < p; ++i) {
				phi[(j + 1)*s + i + 1] -= fit->sarimax->phi[i] * fit->sarimax->PHI[j];
			}
		}

		for (j = 0; j < Q; ++j) {
			theta[(j + 1)*s] -= fit->sarimax->THETA[j];
			for (i = 0; i < q; ++i) {
				theta[(j + 1)*s + i + 1] += fit->sarimax->theta[i] * fit->sarimax->THETA[j];
			}
		}

		ir = (ip > iq) ? ip : iq;

		K = (int*)malloc(sizeof(int)*ir);
		zeror = (double*)malloc(sizeof(double)*ir);
		zeroi = (double*)malloc(sizeof(double)*ir);

		//printf(" p P %d \n", p+P);

		if (p + P > 0) {
			isum = 0;
			imx = -1;
			for(i = 0; i < ip - 1; ++i) {
				K[i] = (fabs(phi[i+1]) > tol) ? 1 : 0; 
				if (K[i] == 1) {
					isum += 1;
					imx = i;
				}
			}

			last_nonzero = imx + 1;

			if (last_nonzero > 0) {
				for(i = 0; i < last_nonzero; ++i) {
					phi[i+1] *= -1.0;
				}

				retval = polyroot(phi,last_nonzero,zeror,zeroi);

				if (retval == 0) {
					for(i = 0; i < last_nonzero;++i) {
						temp = sqrt(zeror[i]*zeror[i] + zeroi[i]*zeroi[i]);
						if (temp < minroot) minroot = temp;
					}
				} else {
					fit->ic = DBL_MAX;
				}

			}

		}

		//printf(" q Q %d \n", q+Q);

		if (q + Q > 1 && fit->ic < DBL_MAX) {
			isum = 0;
			imx = -1;
			for(i = 0; i < iq - 1; ++i) {
				K[i] = (fabs(theta[i+1]) > tol) ? 1 : 0; 
				if (K[i] == 1) {
					isum += 1;
					imx = i;
				}
			}

			last_nonzero = imx + 1;

			if (last_nonzero > 0) {

				retval = polyroot(theta,last_nonzero,zeror,zeroi);

				if (retval == 0) {
					for(i = 0; i < last_nonzero;++i) {
						temp = sqrt(zeror[i]*zeror[i] + zeroi[i]*zeroi[i]);
						if (temp < minroot) minroot = temp;
					}
				} else {
					fit->ic = DBL_MAX;
				}

			}

			
		}

		if (minroot < 1.01) {
			fit->ic = DBL_MAX;
		}



		free(phi);
		free(theta);
		free(K);
		free(zeror);
		free(zeroi);
	} else {
		fit->ic = DBL_MAX;
	}

	return fit;
}